

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowStackToolWindow(bool *p_open)

{
  bool *v;
  uint uVar1;
  ImGuiWindow *pIVar2;
  _func_void_void_ptr_char_ptr *p_Var3;
  ImGuiStackLevelInfo *pIVar4;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImU32 color;
  byte *pbVar11;
  byte *pbVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  ulong uVar18;
  ImGuiContext *g;
  byte *pbVar19;
  float fVar20;
  char level_desc [256];
  ImVec4 local_138 [16];
  
  pIVar8 = GImGui;
  uVar1 = (GImGui->NextWindowData).Flags;
  if ((uVar1 & 2) == 0) {
    fVar20 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar1 | 2;
    (pIVar8->NextWindowData).SizeVal.x = 0.0;
    (pIVar8->NextWindowData).SizeVal.y = fVar20 * 8.0;
    (pIVar8->NextWindowData).SizeCond = 4;
  }
  bVar10 = Begin("Dear ImGui Stack Tool",p_open,0);
  pIVar9 = GImGui;
  if ((bVar10) &&
     (GImGui->CurrentWindow->WriteAccessed = true, pIVar9->CurrentWindow->BeginCount < 2)) {
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar8->HoveredIdPreviousFrame,
         (ulong)pIVar8->ActiveId);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    MetricsHelpMarker(
                     "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                     );
    fVar20 = (float)pIVar8->Time - (pIVar8->DebugStackTool).CopyToClipboardLastTime;
    v = &(pIVar8->DebugStackTool).CopyToClipboardOnCtrlC;
    Checkbox("Ctrl+C: copy path to clipboard",v);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    if (((fVar20 < 0.0) || (0.75 <= fVar20)) || (fVar20 = fmodf(fVar20,0.25), 0.125 <= fVar20)) {
      local_138[0].x = 0.0;
      local_138[0].y = 0.0;
      local_138[0].z = 0.0;
      local_138[0].w = 0.0;
    }
    else {
      local_138[0].x = 1.0;
      local_138[0].y = 1.0;
      local_138[0].z = 0.3;
      local_138[0].w = 1.0;
    }
    TextColored(local_138,"*COPIED*");
    if (((*v == true) && (bVar10 = IsKeyDown(ImGuiKey_ModCtrl), bVar10)) &&
       (bVar10 = IsKeyPressed(ImGuiKey_C,0,1), bVar10)) {
      (pIVar8->DebugStackTool).CopyToClipboardLastTime = (float)pIVar8->Time;
      pbVar11 = (byte *)(pIVar8->TempBuffer).Data;
      iVar13 = (pIVar8->TempBuffer).Size;
      if (3 < iVar13 && 0 < (pIVar8->DebugStackTool).Results.Size) {
        pbVar19 = pbVar11 + iVar13;
        iVar13 = 0;
        pbVar16 = pbVar11;
        do {
          *pbVar16 = 0x2f;
          StackToolFormatLevelInfo(&pIVar8->DebugStackTool,iVar13,false,(char *)local_138,0x100);
          pbVar11 = pbVar16 + 1;
          uVar18 = local_138[0]._0_8_ & 0xff;
          if (local_138[0].x._0_1_ != '\0') {
            pbVar12 = (byte *)((long)&local_138[0].x + 1);
            while (pbVar16 + 3 < pbVar19) {
              pbVar17 = pbVar11;
              if ((char)uVar18 == '/') {
                *pbVar11 = 0x5c;
                pbVar17 = pbVar16 + 2;
              }
              *pbVar17 = pbVar12[-1];
              pbVar11 = pbVar17 + 1;
              uVar18 = (ulong)*pbVar12;
              if (*pbVar12 == 0) break;
              pbVar12 = pbVar12 + 1;
              pbVar16 = pbVar17;
            }
          }
          iVar13 = iVar13 + 1;
        } while ((iVar13 < (pIVar8->DebugStackTool).Results.Size) &&
                (pbVar16 = pbVar11, pbVar11 + 3 < pbVar19));
      }
      *pbVar11 = 0;
      p_Var3 = (GImGui->IO).SetClipboardTextFn;
      if (p_Var3 != (_func_void_void_ptr_char_ptr *)0x0) {
        (*p_Var3)((GImGui->IO).ClipboardUserData,(pIVar8->TempBuffer).Data);
      }
    }
    (pIVar8->DebugStackTool).LastActiveFrame = pIVar8->FrameCount;
    if (0 < (pIVar8->DebugStackTool).Results.Size) {
      local_138[0].x = 0.0;
      local_138[0].y = 0.0;
      bVar10 = BeginTable("##table",3,0x780,(ImVec2 *)local_138,0.0);
      if (bVar10) {
        IVar5 = ImFont::CalcTextSizeA
                          (GImGui->Font,GImGui->FontSize,3.4028235e+38,-1.0,"0xDDDDDDDD",(char *)0x0
                           ,(char **)0x0);
        fVar20 = (float)(int)(IVar5.x + 0.99999);
        TableSetupColumn("Seed",0x10,fVar20,0);
        TableSetupColumn("PushID",8,0.0,0);
        TableSetupColumn("Result",0x10,fVar20,0);
        TableHeadersRow();
        if (0 < (pIVar8->DebugStackTool).Results.Size) {
          lVar14 = 0;
          uVar18 = 0;
          do {
            pIVar4 = (pIVar8->DebugStackTool).Results.Data;
            TableNextColumn();
            uVar15 = 0;
            if (uVar18 != 0) {
              uVar15 = (ulong)*(uint *)((pIVar8->DebugStackTool).Results.Data[-1].Desc + lVar14 + -7
                                       );
            }
            Text("0x%08X",uVar15);
            TableNextColumn();
            StackToolFormatLevelInfo
                      (&pIVar8->DebugStackTool,(int)uVar18,true,(pIVar8->TempBuffer).Data,
                       (long)(pIVar8->TempBuffer).Size);
            TextUnformatted((pIVar8->TempBuffer).Data,(char *)0x0);
            TableNextColumn();
            Text("0x%08X",(ulong)*(uint *)(pIVar4->Desc + lVar14 + -7));
            if (uVar18 == (pIVar8->DebugStackTool).Results.Size - 1) {
              local_138[0].x = (GImGui->Style).Colors[0x18].x;
              local_138[0].y = (GImGui->Style).Colors[0x18].y;
              uVar6 = (GImGui->Style).Colors[0x18].z;
              uVar7 = (GImGui->Style).Colors[0x18].w;
              local_138[0].w = (GImGui->Style).Alpha * (float)uVar7;
              local_138[0].z = (float)uVar6;
              color = ColorConvertFloat4ToU32(local_138);
              TableSetBgColor(3,color,-1);
            }
            uVar18 = uVar18 + 1;
            lVar14 = lVar14 + 0x40;
          } while ((long)uVar18 < (long)(pIVar8->DebugStackTool).Results.Size);
        }
        EndTable();
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiMod_Ctrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer.Data;
        char* p_end = p + g.TempBuffer.Size;
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer.Data);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer.Data, g.TempBuffer.Size);
            TextUnformatted(g.TempBuffer.Data);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}